

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O2

int ModelFrameHash(FSpriteModelFrame *smf)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = 0xffffffff;
  lVar1 = get_crc_table();
  for (lVar3 = -0x18; lVar3 != 0; lVar3 = lVar3 + 1) {
    uVar2 = uVar2 >> 8 ^
            *(uint *)(lVar1 + (ulong)(uVar2 & 0xff ^
                                     (uint)*(byte *)((long)smf->modelframes + lVar3 + 0x60)) * 4);
  }
  return ~uVar2;
}

Assistant:

static int ModelFrameHash(FSpriteModelFrame * smf)
{
	const uint32_t *table = GetCRCTable ();
	uint32_t hash = 0xffffffff;

	const char * s = (const char *)(&smf->type);	// this uses type, sprite and frame for hashing
	const char * se= (const char *)(&smf->hashnext);

	for (; s<se; s++)
	{
		hash = CRC1 (hash, *s, table);
	}
	return hash ^ 0xffffffff;
}